

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMeshType.cpp
# Opt level: O2

int MMeshType_Dimension(MMeshType meshType)

{
  if (meshType < 8) {
    return *(int *)(&DAT_0135eff4 + (ulong)meshType * 4);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/MMeshType.cpp",
             0x31);
}

Assistant:

int MMeshType_Dimension(const MMeshType meshType){
    switch(meshType){
        case MMeshType::ETriangular:
        case MMeshType::EQuadrilateral:
            return 2;
        case MMeshType::ETetrahedral:
        case MMeshType::EPyramidal:
        case MMeshType::EPrismatic:
        case MMeshType::EHexahedral:
        case MMeshType::EHexaPyrMixed:
            return 3;
        case MMeshType::ENoType:
            return -1;
    }
    DebugStop();
    return -1;

}